

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.h
# Opt level: O1

vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_> *
cppwinrt::get_bases(vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>
                    *__return_storage_ptr__,TypeDef *type)

{
  pointer *ppTVar1;
  iterator __position;
  TypeDef TVar2;
  TypeDef local_20;
  
  (__return_storage_ptr__->
  super__Vector_base<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  TVar2 = get_base_class(type);
  local_20.super_row_base<winmd::reader::TypeDef>.m_table =
       TVar2.super_row_base<winmd::reader::TypeDef>.m_table;
  local_20.super_row_base<winmd::reader::TypeDef>.m_index =
       TVar2.super_row_base<winmd::reader::TypeDef>.m_index;
  if (local_20.super_row_base<winmd::reader::TypeDef>.m_table != (table_base *)0x0) {
    do {
      __position._M_current =
           (__return_storage_ptr__->
           super__Vector_base<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<winmd::reader::TypeDef,std::allocator<winmd::reader::TypeDef>>::
        _M_realloc_insert<winmd::reader::TypeDef_const&>
                  ((vector<winmd::reader::TypeDef,std::allocator<winmd::reader::TypeDef>> *)
                   __return_storage_ptr__,__position,&local_20);
      }
      else {
        ((__position._M_current)->super_row_base<winmd::reader::TypeDef>).m_table =
             local_20.super_row_base<winmd::reader::TypeDef>.m_table;
        *(ulong *)&((__position._M_current)->super_row_base<winmd::reader::TypeDef>).m_index =
             CONCAT44(local_20.super_row_base<winmd::reader::TypeDef>._12_4_,
                      local_20.super_row_base<winmd::reader::TypeDef>.m_index);
        ppTVar1 = &(__return_storage_ptr__->
                   super__Vector_base<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppTVar1 = *ppTVar1 + 1;
      }
      TVar2 = get_base_class(&local_20);
      local_20.super_row_base<winmd::reader::TypeDef>.m_table =
           TVar2.super_row_base<winmd::reader::TypeDef>.m_table;
      local_20.super_row_base<winmd::reader::TypeDef>.m_index =
           TVar2.super_row_base<winmd::reader::TypeDef>.m_index;
    } while (local_20.super_row_base<winmd::reader::TypeDef>.m_table != (table_base *)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

static auto get_bases(TypeDef const& type)
    {
        std::vector<TypeDef> bases;

        for (auto base = get_base_class(type); base; base = get_base_class(base))
        {
            bases.push_back(base);
        }

        return bases;
    }